

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void Curl_expire(Curl_easy *data,time_t milli,expire_id id)

{
  timeval *stamp;
  timeval *ptVar1;
  Curl_multi *pCVar2;
  uint uVar3;
  Curl_tree *pCVar4;
  time_t tVar5;
  timeval tVar6;
  timeval local_38;
  
  pCVar2 = data->multi;
  if (pCVar2 != (Curl_multi *)0x0) {
    tVar6 = curlx_tvnow();
    local_38.tv_sec = tVar6.tv_sec + milli / 1000;
    local_38.tv_usec = (milli % 1000) * 1000 + tVar6.tv_usec;
    if (999999 < local_38.tv_usec) {
      local_38.tv_sec = local_38.tv_sec + 1;
      local_38.tv_usec = local_38.tv_usec + -1000000;
    }
    stamp = &(data->state).expiretime;
    ptVar1 = &(data->state).expiretime;
    if (ptVar1->tv_sec != 0 || (data->state).expiretime.tv_usec != 0) {
      tVar6.tv_usec = local_38.tv_usec;
      tVar6.tv_sec = local_38.tv_sec;
      tVar5 = curlx_tvdiff(tVar6,*ptVar1);
      multi_deltimeout(data,id);
      if (0 < tVar5) {
        multi_addtimeout(data,&local_38,id);
        return;
      }
      multi_addtimeout(data,stamp,id);
      uVar3 = Curl_splayremovebyaddr(pCVar2->timetree,&(data->state).timenode,&pCVar2->timetree);
      if (uVar3 != 0) {
        Curl_infof(data,"Internal error removing splay node = %d\n",(ulong)uVar3);
      }
    }
    stamp->tv_sec = local_38.tv_sec;
    (data->state).expiretime.tv_usec = local_38.tv_usec;
    (data->state).timenode.payload = data;
    pCVar4 = Curl_splayinsert((data->state).expiretime,pCVar2->timetree,&(data->state).timenode);
    pCVar2->timetree = pCVar4;
  }
  return;
}

Assistant:

void Curl_expire(struct Curl_easy *data, time_t milli, expire_id id)
{
  struct Curl_multi *multi = data->multi;
  struct timeval *nowp = &data->state.expiretime;
  int rc;
  struct timeval set;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  DEBUGASSERT(id < EXPIRE_LAST);

  set = Curl_tvnow();
  set.tv_sec += (long)(milli/1000);
  set.tv_usec += (long)(milli%1000)*1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  if(nowp->tv_sec || nowp->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
       is. */
    time_t diff = curlx_tvdiff(set, *nowp);

    /* remove the previous timer first, if there */
    multi_deltimeout(data, id);

    if(diff > 0) {
      /* the new expire time was later so just add it to the queue
         and get out */
      multi_addtimeout(data, &set, id);
      return;
    }

    /* the new time is newer than the presently set one, so add the current
       to the queue and update the head */
    multi_addtimeout(data, nowp, id);

    /* Since this is an updated time, we must remove the previous entry from
       the splay tree first and then re-add the new value */
    rc = Curl_splayremovebyaddr(multi->timetree,
                                &data->state.timenode,
                                &multi->timetree);
    if(rc)
      infof(data, "Internal error removing splay node = %d\n", rc);
  }

  *nowp = set;
  data->state.timenode.payload = data;
  multi->timetree = Curl_splayinsert(*nowp, multi->timetree,
                                     &data->state.timenode);
}